

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Progress.cxx
# Opt level: O0

void __thiscall Fl_Progress::draw(Fl_Progress *this)

{
  Fl_Boxtype FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  Fl_Color FVar9;
  Fl_Color bg;
  int iVar10;
  int iVar11;
  int iVar12;
  Fl_Color local_b8;
  Fl_Color local_94;
  Fl_Color local_60;
  Fl_Color c;
  int tw;
  int tx;
  int bh;
  int bw;
  int by;
  int bx;
  int progress;
  Fl_Progress *this_local;
  
  FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
  iVar2 = Fl::box_dx(FVar1);
  FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
  iVar3 = Fl::box_dy(FVar1);
  FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
  iVar4 = Fl::box_dw(FVar1);
  FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
  iVar5 = Fl::box_dh(FVar1);
  iVar6 = Fl_Widget::x(&this->super_Fl_Widget);
  iVar6 = iVar6 + iVar2;
  iVar7 = Fl_Widget::w(&this->super_Fl_Widget);
  iVar7 = iVar7 - iVar4;
  if (this->maximum_ < this->minimum_ || this->maximum_ == this->minimum_) {
    by = 0;
  }
  else {
    iVar4 = Fl_Widget::w(&this->super_Fl_Widget);
    by = (int)(((float)iVar4 * (this->value_ - this->minimum_)) / (this->maximum_ - this->minimum_)
              + 0.5);
  }
  if (by < 1) {
    FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar2 = Fl_Widget::x(&this->super_Fl_Widget);
    iVar4 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar10 = Fl_Widget::w(&this->super_Fl_Widget);
    iVar11 = Fl_Widget::h(&this->super_Fl_Widget);
    iVar12 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar12 == 0) {
      FVar8 = Fl_Widget::color(&this->super_Fl_Widget);
      local_b8 = fl_inactive(FVar8);
    }
    else {
      local_b8 = Fl_Widget::color(&this->super_Fl_Widget);
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar1,iVar2,iVar4,iVar10,iVar11,local_b8);
    iVar2 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar4 = Fl_Widget::h(&this->super_Fl_Widget);
    Fl_Widget::draw_label(&this->super_Fl_Widget,iVar6,iVar2 + iVar3,iVar7,iVar4 - iVar5);
  }
  else {
    FVar8 = Fl_Widget::labelcolor(&this->super_Fl_Widget);
    FVar9 = Fl_Widget::labelcolor(&this->super_Fl_Widget);
    bg = Fl_Widget::selection_color(&this->super_Fl_Widget);
    FVar9 = fl_contrast(FVar9,bg);
    Fl_Widget::labelcolor(&this->super_Fl_Widget,FVar9);
    iVar4 = Fl_Widget::x(&this->super_Fl_Widget);
    iVar10 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar11 = Fl_Widget::h(&this->super_Fl_Widget);
    fl_push_clip(iVar4,iVar10,by + iVar2,iVar11);
    FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar2 = Fl_Widget::x(&this->super_Fl_Widget);
    iVar4 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar10 = Fl_Widget::w(&this->super_Fl_Widget);
    iVar11 = Fl_Widget::h(&this->super_Fl_Widget);
    iVar12 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar12 == 0) {
      FVar9 = Fl_Widget::selection_color(&this->super_Fl_Widget);
      local_60 = fl_inactive(FVar9);
    }
    else {
      local_60 = Fl_Widget::selection_color(&this->super_Fl_Widget);
    }
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar1,iVar2,iVar4,iVar10,iVar11,local_60);
    iVar2 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar4 = Fl_Widget::h(&this->super_Fl_Widget);
    Fl_Widget::draw_label(&this->super_Fl_Widget,iVar6,iVar2 + iVar3,iVar7,iVar4 - iVar5);
    fl_pop_clip();
    Fl_Widget::labelcolor(&this->super_Fl_Widget,FVar8);
    iVar2 = Fl_Widget::w(&this->super_Fl_Widget);
    if (by < iVar2) {
      iVar2 = Fl_Widget::y(&this->super_Fl_Widget);
      iVar4 = Fl_Widget::w(&this->super_Fl_Widget);
      iVar10 = Fl_Widget::h(&this->super_Fl_Widget);
      fl_push_clip(iVar6 + by,iVar2,iVar4 - by,iVar10);
      FVar1 = Fl_Widget::box(&this->super_Fl_Widget);
      iVar2 = Fl_Widget::x(&this->super_Fl_Widget);
      iVar4 = Fl_Widget::y(&this->super_Fl_Widget);
      iVar10 = Fl_Widget::w(&this->super_Fl_Widget);
      iVar11 = Fl_Widget::h(&this->super_Fl_Widget);
      iVar12 = Fl_Widget::active_r(&this->super_Fl_Widget);
      if (iVar12 == 0) {
        FVar8 = Fl_Widget::color(&this->super_Fl_Widget);
        local_94 = fl_inactive(FVar8);
      }
      else {
        local_94 = Fl_Widget::color(&this->super_Fl_Widget);
      }
      Fl_Widget::draw_box(&this->super_Fl_Widget,FVar1,iVar2,iVar4,iVar10,iVar11,local_94);
      iVar2 = Fl_Widget::y(&this->super_Fl_Widget);
      iVar4 = Fl_Widget::h(&this->super_Fl_Widget);
      Fl_Widget::draw_label(&this->super_Fl_Widget,iVar6,iVar2 + iVar3,iVar7,iVar4 - iVar5);
      fl_pop_clip();
    }
  }
  return;
}

Assistant:

void Fl_Progress::draw()
{
  int	progress;	// Size of progress bar...
  int	bx, by, bw, bh;	// Box areas...
  int	tx, tw;		// Temporary X + width


  // Get the box borders...
  bx = Fl::box_dx(box());
  by = Fl::box_dy(box());
  bw = Fl::box_dw(box());
  bh = Fl::box_dh(box());

  tx = x() + bx;
  tw = w() - bw;

  // Draw the progress bar...
  if (maximum_ > minimum_)
    progress = (int)(w() * (value_ - minimum_) / (maximum_ - minimum_) + 0.5f);
  else
    progress = 0;

  // Draw the box and label...
  if (progress > 0) {
    Fl_Color c = labelcolor();
    labelcolor(fl_contrast(labelcolor(), selection_color()));

    fl_push_clip(x(), y(), progress + bx, h());
      draw_box(box(), x(), y(), w(), h(), active_r() ? selection_color() : fl_inactive(selection_color()));
      draw_label(tx, y() + by, tw, h() - bh);
    fl_pop_clip();

    labelcolor(c);

    if (progress<w()) {
      fl_push_clip(tx + progress, y(), w() - progress, h());
        draw_box(box(), x(), y(), w(), h(), active_r() ? color() : fl_inactive(color()));
        draw_label(tx, y() + by, tw, h() - bh);
      fl_pop_clip();
    }
  } else {
    draw_box(box(), x(), y(), w(), h(), active_r() ? color() : fl_inactive(color()));
    draw_label(tx, y() + by, tw, h() - bh);
  }
}